

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

void __thiscall
wasm::OptimizeInstructions::optimizeStoredValue
          (OptimizeInstructions *this,Expression **value,Index bytes)

{
  Expression *pEVar1;
  Type type;
  int *piVar2;
  int32_t iVar3;
  Index IVar4;
  Expression *pEVar5;
  uint x;
  Literal *this_00;
  anon_union_16_5_9943fe1e_for_Literal_0 local_58;
  undefined8 local_48;
  Literal local_40;
  
  pEVar1 = *value;
  type.id = (pEVar1->type).id;
  if ((type.id & 0xfffffffffffffffe) == 2) {
    if (pEVar1->_id == ConstId) {
      this_00 = (Literal *)(pEVar1 + 1);
      if (bytes == 4 && type.id == 3) {
        local_58.i64 = 0xffffffff;
        local_48 = 3;
        Literal::and_(&local_40,this_00,(Literal *)&local_58.func);
        Literal::operator=(this_00,&local_40);
      }
      else {
        x = 0xffffffff >> (-(char)(bytes * 8) & 0x1fU);
        if (0x1f < (int)(bytes * 8)) {
          x = 0xffffffff;
        }
        Literal::makeFromInt32((Literal *)&local_58.func,x,type);
        Literal::and_(&local_40,this_00,(Literal *)&local_58.func);
        Literal::operator=(this_00,&local_40);
      }
      Literal::~Literal(&local_40);
      Literal::~Literal((Literal *)&local_58.func);
    }
    pEVar1 = *value;
    if (pEVar1->_id == BinaryId) {
      if (pEVar1[1]._id == CallIndirectId) {
        piVar2 = *(int **)(pEVar1 + 2);
        if (*piVar2 != 0xe) {
          return;
        }
        if (*(long *)(piVar2 + 2) != 2) {
          return;
        }
        iVar3 = Literal::geti32((Literal *)(piVar2 + 4));
        if ((bytes != 1) || (iVar3 != 0xff)) {
          if (bytes != 2) {
            return;
          }
          if (iVar3 != 0xffff) {
            return;
          }
        }
        pEVar5 = (Expression *)pEVar1[1].type.id;
      }
      else {
        pEVar5 = Properties::getSignExtValue(pEVar1);
        if (pEVar5 == (Expression *)0x0) {
          return;
        }
        IVar4 = Properties::getSignExtBits(pEVar1);
        if (IVar4 < bytes << 3) {
          return;
        }
      }
      *value = pEVar5;
    }
  }
  return;
}

Assistant:

void optimizeStoredValue(Expression*& value, Index bytes) {
    if (!value->type.isInteger()) {
      return;
    }
    // truncates constant values during stores
    // (i32|i64).store(8|16|32)(p, C)   ==>
    //    (i32|i64).store(8|16|32)(p, C & mask)
    if (auto* c = value->dynCast<Const>()) {
      if (value->type == Type::i64 && bytes == 4) {
        c->value = c->value.and_(Literal(uint64_t(0xffffffff)));
      } else {
        c->value = c->value.and_(
          Literal::makeFromInt32(Bits::lowBitMask(bytes * 8), value->type));
      }
    }
    // stores of fewer bits truncates anyhow
    if (auto* binary = value->dynCast<Binary>()) {
      if (binary->op == AndInt32) {
        if (auto* right = binary->right->dynCast<Const>()) {
          if (right->type == Type::i32) {
            auto mask = right->value.geti32();
            if ((bytes == 1 && mask == 0xff) ||
                (bytes == 2 && mask == 0xffff)) {
              value = binary->left;
            }
          }
        }
      } else if (auto* ext = Properties::getSignExtValue(binary)) {
        // if sign extending the exact bit size we store, we can skip the
        // extension if extending something bigger, then we just alter bits we
        // don't save anyhow
        if (Properties::getSignExtBits(binary) >= Index(bytes) * 8) {
          value = ext;
        }
      }
    }
  }